

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_leaflist(lysp_ctx *ctx,lysp_stmt *stmt,lysp_node *parent,lysp_node **siblings)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  ly_stmt stmt_00;
  lysp_stmt *stmt_01;
  lyd_node *plVar1;
  int iVar2;
  LY_ERR LVar3;
  lysp_node *plVar4;
  lysp_node *plVar5;
  char *pcVar6;
  char *format;
  uint32_t substmt_index;
  lysp_node *plVar7;
  ly_ctx *plVar8;
  lysp_ext_instance **in_R8;
  lysp_ext_instance **in_R9;
  char *pcVar9;
  lysp_stmt **pplVar10;
  
  LVar3 = lysp_stmt_validate_value(ctx,Y_IDENTIF_ARG,stmt->arg);
  if (LVar3 == LY_SUCCESS) {
    plVar4 = (lysp_node *)calloc(1,0xd0);
    if (plVar4 == (lysp_node *)0x0) {
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = LY_EMEM;
      ly_log(plVar8,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_leaflist");
    }
    else {
      plVar7 = *siblings;
      if (*siblings != (lysp_node *)0x0) {
        do {
          plVar5 = plVar7;
          plVar7 = plVar5->next;
        } while (plVar7 != (lysp_node *)0x0);
        siblings = &plVar5->next;
      }
      *siblings = plVar4;
      plVar4->nodetype = 8;
      plVar4->parent = parent;
      if (ctx == (lysp_ctx *)0x0) {
        plVar8 = (ly_ctx *)0x0;
      }
      else {
        plVar8 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      LVar3 = lydict_insert(plVar8,stmt->arg,0,&plVar4->name);
      if (LVar3 == LY_SUCCESS) {
        exts = &plVar4->exts;
        iVar2 = (int)plVar4;
        flags = &plVar4->flags;
        pplVar10 = &stmt->child;
        while (stmt_01 = *pplVar10, stmt_01 != (lysp_stmt *)0x0) {
          stmt_00 = stmt_01->kw;
          if (stmt_00 == LY_STMT_WHEN) {
            LVar3 = lysp_stmt_when(ctx,stmt_01,(lysp_when **)&plVar4[1].nodetype);
          }
          else if (stmt_00 == LY_STMT_DEFAULT) {
            plVar1 = (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            plVar7 = plVar4 + 3;
            if (*(byte *)&plVar1[2].schema < 2) {
              plVar8 = (ly_ctx *)**(undefined8 **)plVar1;
              format = 
              "Invalid keyword \"%s\" as a child of \"%s\" - the statement is allowed only in YANG 1.1 modules."
              ;
              pcVar6 = "yang:orig-default";
              goto LAB_001666bb;
            }
LAB_0016663e:
            LVar3 = lysp_stmt_qnames(ctx,stmt_01,(lysp_qname **)plVar7,(yang_arg)exts,in_R8);
          }
          else {
            substmt_index = iVar2 + 0x20;
            if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_001665cc;
            if (stmt_00 == LY_STMT_EXTENSION_INSTANCE) {
              in_R8 = exts;
              LVar3 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_LEAF_LIST,0,exts);
            }
            else {
              plVar7 = (lysp_node *)&plVar4->iffeatures;
              if (stmt_00 == LY_STMT_IF_FEATURE) goto LAB_0016663e;
              if (stmt_00 == LY_STMT_MAX_ELEMENTS) {
                in_R8 = exts;
                LVar3 = lysp_stmt_maxelements
                                  (ctx,stmt_01,(uint32_t *)&plVar4[3].field_0xc,flags,exts);
              }
              else if (stmt_00 == LY_STMT_MIN_ELEMENTS) {
                in_R8 = exts;
                LVar3 = lysp_stmt_minelements
                                  (ctx,stmt_01,(uint32_t *)&plVar4[3].nodetype,flags,exts);
              }
              else if (stmt_00 == LY_STMT_MUST) {
                LVar3 = lysp_stmt_restrs(ctx,stmt_01,(lysp_restr **)(plVar4 + 1));
              }
              else if (stmt_00 == LY_STMT_ORDERED_BY) {
                LVar3 = lysp_stmt_orderedby(ctx,stmt_01,flags,exts);
              }
              else {
                substmt_index = iVar2 + 0x28;
                if (stmt_00 == LY_STMT_REFERENCE) {
LAB_001665cc:
                  in_R8 = exts;
                  LVar3 = lysp_stmt_text_field
                                    (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)exts,in_R9);
                }
                else if (stmt_00 == LY_STMT_STATUS) {
                  LVar3 = lysp_stmt_status(ctx,stmt_01,flags,exts);
                }
                else if (stmt_00 == LY_STMT_TYPE) {
                  LVar3 = lysp_stmt_type(ctx,stmt_01,(lysp_type *)&plVar4[1].next);
                }
                else {
                  substmt_index = iVar2 + 0xb8;
                  if (stmt_00 == LY_STMT_UNITS) goto LAB_001665cc;
                  if (stmt_00 != LY_STMT_CONFIG) {
                    if (ctx == (lysp_ctx *)0x0) {
                      plVar8 = (ly_ctx *)0x0;
                    }
                    else {
                      plVar8 = (ly_ctx *)
                               **(undefined8 **)
                                 (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                    }
                    pcVar6 = lyplg_ext_stmt2str(stmt_00);
                    format = "Invalid keyword \"%s\" as a child of \"%s\".";
                    pcVar9 = "llist";
                    goto LAB_001666c7;
                  }
                  LVar3 = lysp_stmt_config(ctx,stmt_01,flags,exts);
                }
              }
            }
          }
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          pplVar10 = &stmt_01->next;
        }
        LVar3 = LY_SUCCESS;
        if (plVar4[1].next == (lysp_node *)0x0) {
          if (ctx == (lysp_ctx *)0x0) {
            plVar8 = (ly_ctx *)0x0;
          }
          else {
            plVar8 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
          pcVar6 = "decimal64 type";
LAB_001666bb:
          pcVar6 = pcVar6 + 10;
          pcVar9 = "leaf-list";
LAB_001666c7:
          ly_vlog(plVar8,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar6,pcVar9);
          LVar3 = LY_EVALID;
        }
      }
    }
  }
  return LVar3;
}

Assistant:

static LY_ERR
lysp_stmt_leaflist(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_node *parent,
        struct lysp_node **siblings)
{
    struct lysp_node_leaflist *llist;

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_IDENTIF_ARG, stmt->arg));

    /* create new leaf-list structure */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, llist, next, LY_EMEM);
    llist->nodetype = LYS_LEAFLIST;
    llist->parent = parent;

    /* get name */
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &llist->name));

    /* parse substatements */
    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(lysp_stmt_config(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_DEFAULT:
            PARSER_CHECK_STMTVER2_RET(ctx, "default", "leaf-list");
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &llist->dflts, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->dsc, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(lysp_stmt_qnames(ctx, child, &llist->iffeatures, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_MAX_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_maxelements(ctx, child, &llist->max, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MIN_ELEMENTS:
            LY_CHECK_RET(lysp_stmt_minelements(ctx, child, &llist->min, &llist->flags, &llist->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(lysp_stmt_restrs(ctx, child, &llist->musts));
            break;
        case LY_STMT_ORDERED_BY:
            LY_CHECK_RET(lysp_stmt_orderedby(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->ref, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(lysp_stmt_status(ctx, child, &llist->flags, &llist->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(lysp_stmt_type(ctx, child, &llist->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &llist->units, Y_STR_ARG, &llist->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(lysp_stmt_when(ctx, child, &llist->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_LEAF_LIST, 0, &llist->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "llist");
            return LY_EVALID;
        }
    }

    /* mandatory substatements */
    if (!llist->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "leaf-list");
        return LY_EVALID;
    }

    return LY_SUCCESS;
}